

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O2

bool __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Function::dynamic_object_typename_match
          (Dynamic_Object_Function *this,Boxed_Value *bv,string *name,
          unique_ptr<chaiscript::Type_Info,_std::default_delete<chaiscript::Type_Info>_> *ti,
          Type_Conversions_State *t_conversions)

{
  Type_Info *ti_00;
  bool bVar1;
  bool bVar2;
  __type _Var3;
  Dynamic_Object *__lhs;
  
  bVar1 = Type_Info::bare_equal
                    (&((bv->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_type_info,&this->m_doti);
  if (bVar1) {
    __lhs = boxed_cast<chaiscript::dispatch::Dynamic_Object_const&>(bv,t_conversions);
    bVar2 = std::operator==(name,"Dynamic_Object");
    bVar1 = true;
    if (!bVar2) {
      _Var3 = std::operator==(&__lhs->m_type_name,name);
      return _Var3;
    }
  }
  else {
    ti_00 = (ti->_M_t).
            super___uniq_ptr_impl<chaiscript::Type_Info,_std::default_delete<chaiscript::Type_Info>_>
            ._M_t.
            super__Tuple_impl<0UL,_chaiscript::Type_Info_*,_std::default_delete<chaiscript::Type_Info>_>
            .super__Head_base<0UL,_chaiscript::Type_Info_*,_false>._M_head_impl;
    if (ti_00 != (Type_Info *)0x0) {
      bVar1 = Type_Info::bare_equal
                        (&((bv->m_data).
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->m_type_info,ti_00);
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool dynamic_object_typename_match(const Boxed_Value &bv,
                                           const std::string &name,
                                           const std::unique_ptr<Type_Info> &ti,
                                           const Type_Conversions_State &t_conversions) const noexcept {
          if (bv.get_type_info().bare_equal(m_doti)) {
            try {
              const Dynamic_Object &d = boxed_cast<const Dynamic_Object &>(bv, &t_conversions);
              return name == "Dynamic_Object" || d.get_type_name() == name;
            } catch (const std::bad_cast &) {
              return false;
            }
          } else {
            if (ti) {
              return bv.get_type_info().bare_equal(*ti);
            } else {
              return false;
            }
          }
        }